

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O3

void f3(ct22 *a)

{
  spin_mutex_t sVar1;
  ostream *poVar2;
  long lVar3;
  
  LOCK();
  success_counter.super___atomic_base<int>._M_i =
       (__atomic_base<int>)
       ((int)success_counter.super___atomic_base<int>._M_i +
       (uint)(0x37 < (int)x.super___atomic_base<int>._M_i));
  UNLOCK();
  inwritemode = true;
  do {
    sVar1.lock_.super___atomic_flag_base._M_i = my_io_mutex.lock_.super___atomic_flag_base._M_i;
    LOCK();
    my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x1;
    UNLOCK();
  } while ((__atomic_flag_base)sVar1.lock_.super___atomic_flag_base._M_i != false);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"-------------\nf3 ",0x11);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(*a)[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," begin: ",8);
  lVar3 = std::chrono::_V2::system_clock::now();
  poVar2 = std::ostream::_M_insert<double>((double)(lVar3 - (long)t0.__d.__r) / 1000000000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  (*a)[0] = (*a)[0] + 1;
  fun(false,600);
  do {
    sVar1.lock_.super___atomic_flag_base._M_i = my_io_mutex.lock_.super___atomic_flag_base._M_i;
    LOCK();
    my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x1;
    UNLOCK();
  } while ((__atomic_flag_base)sVar1.lock_.super___atomic_flag_base._M_i != false);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"f3 ",3);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(*a)[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," end: ",6);
  lVar3 = std::chrono::_V2::system_clock::now();
  poVar2 = std::ostream::_M_insert<double>((double)(lVar3 - (long)t0.__d.__r) / 1000000000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  inwritemode = false;
  LOCK();
  x.super___atomic_base<int>._M_i =
       (__atomic_base<int>)((int)x.super___atomic_base<int>._M_i + -0x38);
  UNLOCK();
  return;
}

Assistant:

void f3(ct22& a)
{ 
  success_counter.fetch_add(x >= (32 + 16 + 8)); //f2, f2b and f2c must have finished
  inwritemode = true;
  LOG("-------------\nf3 " << a[0] << " begin: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count());
  a[0]++;
  fun(false);
  LOG("f3 " << a[0] << " end: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count());
  inwritemode = false;
  x.fetch_add(-(32 + 16 + 8));
}